

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMTypeRef
CompileLlvmFunctionType
          (LlvmCompilationContext *ctx,TypeBase *returnType,ArrayView<TypeBase_*> argumentTypes)

{
  TypeBase **ppTVar1;
  ulong uVar2;
  uint i;
  uint index;
  SmallArray<LLVMTypeRefOpaque_*,_32U> arguments;
  LLVMTypeRef local_160;
  ArrayView<TypeBase_*> local_158;
  SmallArray<LLVMTypeRefOpaque_*,_32U> local_148;
  
  uVar2 = argumentTypes._8_8_;
  local_158.data = argumentTypes.data;
  local_158.count = argumentTypes.count;
  local_148.allocator = ctx->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  for (index = 0; index < (uint)uVar2; index = index + 1) {
    ppTVar1 = ArrayView<TypeBase_*>::operator[](&local_158,index);
    local_160 = CompileLlvmType(ctx,*ppTVar1);
    SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back(&local_148,&local_160);
    uVar2 = (ulong)local_158.count;
  }
  CompileLlvmType(ctx,returnType);
  SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(&local_148);
  return (LLVMTypeRef)&placeholderType;
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext& ctx, TypeBase *returnType, ArrayView<TypeBase*> argumentTypes)
{
	bool isStructReturnType = IsStructReturnType(returnType);

	SmallArray<LLVMTypeRef, 32> arguments(ctx.allocator);

	if (isStructReturnType)
	{
		TypeBase* newType = ctx.ctx.GetReferenceType(returnType);

		if (newType->typeIndex == ~0u)
		{
			assert(newType == ctx.ctx.types.back());

			ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
			ctx.types.push_back(NULL);
		}

		arguments.push_back(CompileLlvmType(ctx, newType));
	}

	for (unsigned i = 0; i < argumentTypes.size(); i++)
	{
		TypeBase* argumentType = argumentTypes[i];

		if (IsStructArgumentType(argumentType))
		{
			TypeBase* newType = ctx.ctx.GetReferenceType(argumentType);

			if (newType->typeIndex == ~0u)
			{
				assert(newType == ctx.ctx.types.back());

				ctx.ctx.types.back()->typeIndex = ctx.ctx.types.size() - 1;
				ctx.types.push_back(NULL);
			}

			arguments.push_back(CompileLlvmType(ctx, newType));
		}
		else
		{
			arguments.push_back(CompileLlvmType(ctx, argumentType));
		}
	}

	LLVMTypeRef resultType = isStructReturnType ? LLVMVoidTypeInContext(ctx.context) : CompileLlvmType(ctx, returnType);

	return LLVMFunctionType(resultType, arguments.data, arguments.count, false);
}